

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScene::mousePressEvent(QGraphicsScene *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QGraphicsScenePrivate *d;
  QGraphicsSceneHoverEvent hover;
  QGraphicsSceneHoverEvent *in_stack_00000050;
  QGraphicsScenePrivate *in_stack_00000058;
  QGraphicsSceneMouseEvent *in_stack_000000c8;
  QGraphicsScenePrivate *in_stack_000000d0;
  Type type;
  
  type = (Type)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGraphicsScene *)0x9d2bea);
  bVar2 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9d2bfe);
  if (bVar2) {
    QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent
              ((QGraphicsSceneHoverEvent *)&DAT_aaaaaaaaaaaaaaaa,type);
    _q_hoverFromMouseEvent
              ((QGraphicsSceneHoverEvent *)hover.super_QGraphicsSceneEvent._0_8_,
               (QGraphicsSceneMouseEvent *)this);
    QGraphicsScenePrivate::dispatchHoverEvent(in_stack_00000058,in_stack_00000050);
    QGraphicsSceneHoverEvent::~QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)0x9d2c5b);
  }
  QGraphicsScenePrivate::mousePressEventHandler(in_stack_000000d0,in_stack_000000c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::mousePressEvent(QGraphicsSceneMouseEvent *mouseEvent)
{
    Q_D(QGraphicsScene);
    if (d->mouseGrabberItems.isEmpty()) {
        // Dispatch hover events
        QGraphicsSceneHoverEvent hover;
        _q_hoverFromMouseEvent(&hover, mouseEvent);
        d->dispatchHoverEvent(&hover);
    }

    d->mousePressEventHandler(mouseEvent);
}